

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O2

void __thiscall
spvtools::opt::anon_unknown_7::AmdExtFoldingRules::AddFoldingRules(AmdExtFoldingRules *this)

{
  unordered_map<spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_spvtools::opt::FoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
  *this_00;
  uint32_t uVar1;
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  *pvVar2;
  map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
  *pmVar3;
  key_type local_58;
  function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
  local_50;
  
  this_00 = &(this->super_FoldingRules).rules_;
  local_58.instruction_set = 5000;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_58.instruction_set);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       ReplaceGroupNonuniformOperationOpCode<(spv::Op)349>;
  local_50._M_invoker =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  local_58.instruction_set = 0x1389;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_58.instruction_set);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       ReplaceGroupNonuniformOperationOpCode<(spv::Op)350>;
  local_50._M_invoker =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  local_58.instruction_set = 0x138b;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_58.instruction_set);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       ReplaceGroupNonuniformOperationOpCode<(spv::Op)354>;
  local_50._M_invoker =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  local_58.instruction_set = 0x138c;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_58.instruction_set);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       ReplaceGroupNonuniformOperationOpCode<(spv::Op)353>;
  local_50._M_invoker =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  local_58.instruction_set = 0x138a;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_58.instruction_set);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       ReplaceGroupNonuniformOperationOpCode<(spv::Op)355>;
  local_50._M_invoker =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  local_58.instruction_set = 0x138e;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_58.instruction_set);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       ReplaceGroupNonuniformOperationOpCode<(spv::Op)357>;
  local_50._M_invoker =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  local_58.instruction_set = 0x138f;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_58.instruction_set);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       ReplaceGroupNonuniformOperationOpCode<(spv::Op)356>;
  local_50._M_invoker =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  local_58.instruction_set = 0x138d;
  pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
            *)std::__detail::
              _Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>,_std::allocator<std::pair<const_spv::Op,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::FoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&local_58.instruction_set);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       ReplaceGroupNonuniformOperationOpCode<(spv::Op)358>;
  local_50._M_invoker =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
  ::
  emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
            (pvVar2,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  uVar1 = Module::GetExtInstImportId
                    ((((this->super_FoldingRules).context_)->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                     "SPV_AMD_shader_ballot");
  if (uVar1 != 0) {
    pmVar3 = &(this->super_FoldingRules).ext_rules_;
    local_58.opcode = 1;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object = ReplaceSwizzleInvocations;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 2;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object = ReplaceSwizzleInvocationsMasked;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 3;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object = ReplaceWriteInvocation;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 4;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object = ReplaceMbcnt;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
  }
  uVar1 = Module::GetExtInstImportId
                    ((((this->super_FoldingRules).context_)->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                     "SPV_AMD_shader_trinary_minmax");
  if (uVar1 != 0) {
    pmVar3 = &(this->super_FoldingRules).ext_rules_;
    local_58.opcode = 1;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         ReplaceTrinaryMinMax<(GLSLstd450)37>;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 2;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         ReplaceTrinaryMinMax<(GLSLstd450)38>;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 3;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         ReplaceTrinaryMinMax<(GLSLstd450)39>;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 4;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         ReplaceTrinaryMinMax<(GLSLstd450)40>;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 5;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         ReplaceTrinaryMinMax<(GLSLstd450)41>;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 6;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         ReplaceTrinaryMinMax<(GLSLstd450)42>;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 7;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         (anonymous_namespace)::ReplaceTrinaryMid<(GLSLstd450)37,(GLSLstd450)40,(GLSLstd450)43>;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 8;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         (anonymous_namespace)::ReplaceTrinaryMid<(GLSLstd450)38,(GLSLstd450)41,(GLSLstd450)44>;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 9;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         (anonymous_namespace)::ReplaceTrinaryMid<(GLSLstd450)39,(GLSLstd450)42,(GLSLstd450)45>;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
  }
  uVar1 = Module::GetExtInstImportId
                    ((((this->super_FoldingRules).context_)->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                     "SPV_AMD_gcn_shader");
  if (uVar1 != 0) {
    pmVar3 = &(this->super_FoldingRules).ext_rules_;
    local_58.opcode = 2;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object = ReplaceCubeFaceCoord;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 1;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object = ReplaceCubeFaceIndex;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    local_58.opcode = 3;
    local_58.instruction_set = uVar1;
    pvVar2 = (vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
              *)std::
                map<spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>,_std::less<spvtools::opt::FoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::FoldingRules::Key,_std::vector<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>_>_>_>
                ::operator[](pmVar3,&local_58);
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object = ReplaceTimeAMD;
    local_50._M_invoker =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_bool_(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>,std::allocator<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>>
    ::
    emplace_back<std::function<bool(spvtools::opt::IRContext*,spvtools::opt::Instruction*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&)>>
              (pvVar2,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
  }
  return;
}

Assistant:

virtual void AddFoldingRules() override {
    rules_[spv::Op::OpGroupIAddNonUniformAMD].push_back(
        ReplaceGroupNonuniformOperationOpCode<spv::Op::OpGroupNonUniformIAdd>);
    rules_[spv::Op::OpGroupFAddNonUniformAMD].push_back(
        ReplaceGroupNonuniformOperationOpCode<spv::Op::OpGroupNonUniformFAdd>);
    rules_[spv::Op::OpGroupUMinNonUniformAMD].push_back(
        ReplaceGroupNonuniformOperationOpCode<spv::Op::OpGroupNonUniformUMin>);
    rules_[spv::Op::OpGroupSMinNonUniformAMD].push_back(
        ReplaceGroupNonuniformOperationOpCode<spv::Op::OpGroupNonUniformSMin>);
    rules_[spv::Op::OpGroupFMinNonUniformAMD].push_back(
        ReplaceGroupNonuniformOperationOpCode<spv::Op::OpGroupNonUniformFMin>);
    rules_[spv::Op::OpGroupUMaxNonUniformAMD].push_back(
        ReplaceGroupNonuniformOperationOpCode<spv::Op::OpGroupNonUniformUMax>);
    rules_[spv::Op::OpGroupSMaxNonUniformAMD].push_back(
        ReplaceGroupNonuniformOperationOpCode<spv::Op::OpGroupNonUniformSMax>);
    rules_[spv::Op::OpGroupFMaxNonUniformAMD].push_back(
        ReplaceGroupNonuniformOperationOpCode<spv::Op::OpGroupNonUniformFMax>);

    uint32_t extension_id =
        context()->module()->GetExtInstImportId("SPV_AMD_shader_ballot");

    if (extension_id != 0) {
      ext_rules_[{extension_id, AmdShaderBallotSwizzleInvocationsAMD}]
          .push_back(ReplaceSwizzleInvocations);
      ext_rules_[{extension_id, AmdShaderBallotSwizzleInvocationsMaskedAMD}]
          .push_back(ReplaceSwizzleInvocationsMasked);
      ext_rules_[{extension_id, AmdShaderBallotWriteInvocationAMD}].push_back(
          ReplaceWriteInvocation);
      ext_rules_[{extension_id, AmdShaderBallotMbcntAMD}].push_back(
          ReplaceMbcnt);
    }

    extension_id = context()->module()->GetExtInstImportId(
        "SPV_AMD_shader_trinary_minmax");

    if (extension_id != 0) {
      ext_rules_[{extension_id, FMin3AMD}].push_back(
          ReplaceTrinaryMinMax<GLSLstd450FMin>);
      ext_rules_[{extension_id, UMin3AMD}].push_back(
          ReplaceTrinaryMinMax<GLSLstd450UMin>);
      ext_rules_[{extension_id, SMin3AMD}].push_back(
          ReplaceTrinaryMinMax<GLSLstd450SMin>);
      ext_rules_[{extension_id, FMax3AMD}].push_back(
          ReplaceTrinaryMinMax<GLSLstd450FMax>);
      ext_rules_[{extension_id, UMax3AMD}].push_back(
          ReplaceTrinaryMinMax<GLSLstd450UMax>);
      ext_rules_[{extension_id, SMax3AMD}].push_back(
          ReplaceTrinaryMinMax<GLSLstd450SMax>);
      ext_rules_[{extension_id, FMid3AMD}].push_back(
          ReplaceTrinaryMid<GLSLstd450FMin, GLSLstd450FMax, GLSLstd450FClamp>);
      ext_rules_[{extension_id, UMid3AMD}].push_back(
          ReplaceTrinaryMid<GLSLstd450UMin, GLSLstd450UMax, GLSLstd450UClamp>);
      ext_rules_[{extension_id, SMid3AMD}].push_back(
          ReplaceTrinaryMid<GLSLstd450SMin, GLSLstd450SMax, GLSLstd450SClamp>);
    }

    extension_id =
        context()->module()->GetExtInstImportId("SPV_AMD_gcn_shader");

    if (extension_id != 0) {
      ext_rules_[{extension_id, CubeFaceCoordAMD}].push_back(
          ReplaceCubeFaceCoord);
      ext_rules_[{extension_id, CubeFaceIndexAMD}].push_back(
          ReplaceCubeFaceIndex);
      ext_rules_[{extension_id, TimeAMD}].push_back(ReplaceTimeAMD);
    }
  }